

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::mark_as_packable(CompilerMSL *this,SPIRType *type)

{
  uint32_t uVar1;
  SPIRType *pSVar2;
  size_t sVar3;
  TypedID *this_00;
  SPIRType *mbr_type_alias;
  SPIRType *mbr_type;
  uint local_20;
  uint32_t mbr_type_id;
  uint32_t mbr_idx;
  uint32_t mbr_cnt;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->parent_type);
  if (uVar1 == 0) {
    if (*(int *)&(type->super_IVariant).field_0xc == 0xf) {
      uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      Compiler::set_extended_decoration
                ((Compiler *)this,uVar1,SPIRVCrossDecorationBufferBlockRepacked,0);
      sVar3 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                        (&(type->member_types).
                          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
      for (local_20 = 0; local_20 < (uint)sVar3; local_20 = local_20 + 1) {
        this_00 = (TypedID *)
                  VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                            (&(type->member_types).
                              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                             (ulong)local_20);
        uVar1 = TypedID::operator_cast_to_unsigned_int(this_00);
        pSVar2 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar1);
        mark_as_packable(this,pSVar2);
        uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar2->type_alias);
        if (uVar1 != 0) {
          uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar2->type_alias);
          pSVar2 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar1);
          mark_as_packable(this,pSVar2);
        }
      }
    }
  }
  else {
    uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type->parent_type);
    pSVar2 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar1);
    mark_as_packable(this,pSVar2);
  }
  return;
}

Assistant:

void CompilerMSL::mark_as_packable(SPIRType &type)
{
	// If this is not the base type (eg. it's a pointer or array), tunnel down
	if (type.parent_type)
	{
		mark_as_packable(get<SPIRType>(type.parent_type));
		return;
	}

	if (type.basetype == SPIRType::Struct)
	{
		set_extended_decoration(type.self, SPIRVCrossDecorationBufferBlockRepacked);

		// Recurse
		uint32_t mbr_cnt = uint32_t(type.member_types.size());
		for (uint32_t mbr_idx = 0; mbr_idx < mbr_cnt; mbr_idx++)
		{
			uint32_t mbr_type_id = type.member_types[mbr_idx];
			auto &mbr_type = get<SPIRType>(mbr_type_id);
			mark_as_packable(mbr_type);
			if (mbr_type.type_alias)
			{
				auto &mbr_type_alias = get<SPIRType>(mbr_type.type_alias);
				mark_as_packable(mbr_type_alias);
			}
		}
	}
}